

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void set_golden_update(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  int local_2c;
  int gf_length_mult [2];
  int divisor;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMP *cpi_local;
  
  pAVar1 = cpi->ppi;
  divisor = 10;
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    divisor = cpi->cyclic_refresh->percent_refresh;
  }
  gf_length_mult[0] = 8;
  gf_length_mult[1] = 4;
  if (divisor < 1) {
    (pAVar1->p_rc).baseline_gf_interval = 0x50;
  }
  else {
    if (gf_length_mult[(cpi->sf).rt_sf.gf_length_lvl] * (int)(100 / (long)divisor) < 0xa0) {
      local_2c = gf_length_mult[(cpi->sf).rt_sf.gf_length_lvl] * (int)(100 / (long)divisor);
    }
    else {
      local_2c = 0xa0;
    }
    (pAVar1->p_rc).baseline_gf_interval = local_2c;
  }
  if (((cpi->rc).avg_frame_low_motion != 0) && ((cpi->rc).avg_frame_low_motion < 0x28)) {
    (pAVar1->p_rc).baseline_gf_interval = 0x10;
  }
  return;
}

Assistant:

static void set_golden_update(AV1_COMP *const cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int divisor = 10;
  if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ)
    divisor = cpi->cyclic_refresh->percent_refresh;

  // Set minimum gf_interval for GF update to a multiple of the refresh period,
  // with some max limit. Depending on past encoding stats, GF flag may be
  // reset and update may not occur until next baseline_gf_interval.
  const int gf_length_mult[2] = { 8, 4 };
  if (divisor > 0)
    p_rc->baseline_gf_interval =
        AOMMIN(gf_length_mult[cpi->sf.rt_sf.gf_length_lvl] * (100 / divisor),
               MAX_GF_INTERVAL_RT);
  else
    p_rc->baseline_gf_interval = FIXED_GF_INTERVAL_RT;
  if (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 40)
    p_rc->baseline_gf_interval = 16;
}